

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O2

void __thiscall
flatbuffers::cpp::CppGenerator::GenKeyFieldMethods(CppGenerator *this,FieldDef *field)

{
  CodeWriter *this_00;
  Value *type_00;
  BaseType BVar1;
  StructDef *struct_def;
  size_type struct_def_00;
  string *psVar2;
  byte bVar3;
  string type;
  allocator<char> local_551;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_550;
  string input_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f0;
  string local_4d0;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if (field->key == false) {
    __assert_fail("field.key",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_cpp.cpp"
                  ,0x973,"void flatbuffers::cpp::CppGenerator::GenKeyFieldMethods(const FieldDef &)"
                 );
  }
  BVar1 = (field->value).type.base_type;
  if (BVar1 == BASE_TYPE_STRUCT) {
    bVar3 = ((field->value).type.struct_def)->fixed;
  }
  else {
    bVar3 = 0;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,
             "  bool KeyCompareLessThan(const {{STRUCT_NAME}} * const o) const {",
             (allocator<char> *)&type);
  this_00 = &this->code_;
  CodeWriter::operator+=(this_00,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (BVar1 == BASE_TYPE_STRING) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"    return *{{FIELD_NAME}}() < *o->{{FIELD_NAME}}();",
               (allocator<char> *)&type);
    CodeWriter::operator+=(this_00,&local_70);
    psVar2 = &local_70;
  }
  else if ((BVar1 != BASE_TYPE_ARRAY & (bVar3 ^ 1)) == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"    return KeyCompareWithValue(o->{{FIELD_NAME}}()) < 0;",
               (allocator<char> *)&type);
    CodeWriter::operator+=(this_00,&local_90);
    psVar2 = &local_90;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"    return {{FIELD_NAME}}() < o->{{FIELD_NAME}}();",
               (allocator<char> *)&type);
    CodeWriter::operator+=(this_00,&local_b0);
    psVar2 = &local_b0;
  }
  std::__cxx11::string::~string((string *)psVar2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"  }",(allocator<char> *)&type);
  CodeWriter::operator+=(this_00,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  if (BVar1 == BASE_TYPE_STRING) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,"  int KeyCompareWithValue(const char *_{{FIELD_NAME}}) const {",
               (allocator<char> *)&type);
    CodeWriter::operator+=(this_00,&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_110,"    return strcmp({{FIELD_NAME}}()->c_str(), _{{FIELD_NAME}});"
               ,(allocator<char> *)&type);
    CodeWriter::operator+=(this_00,&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,"  }",(allocator<char> *)&type);
    CodeWriter::operator+=(this_00,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_150,"  template<typename StringType>",(allocator<char> *)&type);
    CodeWriter::operator+=(this_00,&local_150);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_170,
               "  int KeyCompareWithValue(const StringType& _{{FIELD_NAME}}) const {",
               (allocator<char> *)&type);
    CodeWriter::operator+=(this_00,&local_170);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_190,
               "    if ({{FIELD_NAME}}()->c_str() < _{{FIELD_NAME}}) return -1;",
               (allocator<char> *)&type);
    CodeWriter::operator+=(this_00,&local_190);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b0,"    if (_{{FIELD_NAME}} < {{FIELD_NAME}}()->c_str()) return 1;"
               ,(allocator<char> *)&type);
    CodeWriter::operator+=(this_00,&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d0,"    return 0;",(allocator<char> *)&type);
    CodeWriter::operator+=(this_00,&local_1d0);
    psVar2 = &local_1d0;
    goto LAB_00161f99;
  }
  if (BVar1 != BASE_TYPE_ARRAY) {
    type_00 = &field->value;
    if (bVar3 == 0) {
      if (0xb < (type_00->type).base_type - BASE_TYPE_UTYPE) {
        __assert_fail("IsScalar(field.value.type.base_type)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_cpp.cpp"
                      ,0x9c6,
                      "void flatbuffers::cpp::CppGenerator::GenKeyFieldMethods(const FieldDef &)");
      }
      GenTypeBasic_abi_cxx11_(&type,this,&type_00->type,false);
      if ((((this->opts_).super_IDLOptions.scoped_enums == true) &&
          ((field->value).type.enum_def != (EnumDef *)0x0)) &&
         ((type_00->type).base_type - BASE_TYPE_UTYPE < 0xc)) {
        GenTypeGet_abi_cxx11_(&input_type,this,&type_00->type," ","const "," *",true);
        std::__cxx11::string::operator=((string *)&type,(string *)&input_type);
        std::__cxx11::string::~string((string *)&input_type);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&input_type,"KEY_TYPE",(allocator<char> *)&local_550);
      CodeWriter::SetValue(this_00,&input_type,&type);
      std::__cxx11::string::~string((string *)&input_type);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_450,
                 "  int KeyCompareWithValue({{KEY_TYPE}} _{{FIELD_NAME}}) const {",
                 (allocator<char> *)&input_type);
      CodeWriter::operator+=(this_00,&local_450);
      std::__cxx11::string::~string((string *)&local_450);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_470,
                 "    return static_cast<int>({{FIELD_NAME}}() > _{{FIELD_NAME}}) - static_cast<int>({{FIELD_NAME}}() < _{{FIELD_NAME}});"
                 ,(allocator<char> *)&input_type);
      CodeWriter::operator+=(this_00,&local_470);
      std::__cxx11::string::~string((string *)&local_470);
      psVar2 = &type;
    }
    else {
      struct_def = (field->value).type.struct_def;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&type,"INPUT_TYPE",(allocator<char> *)&local_550);
      GenTypeGet_abi_cxx11_(&input_type,this,&type_00->type,"","","",false);
      CodeWriter::SetValue(this_00,&type,&input_type);
      std::__cxx11::string::~string((string *)&input_type);
      std::__cxx11::string::~string((string *)&type);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_390,
                 "  int KeyCompareWithValue(const {{INPUT_TYPE}} &_{{FIELD_NAME}}) const {",
                 (allocator<char> *)&type);
      CodeWriter::operator+=(this_00,&local_390);
      std::__cxx11::string::~string((string *)&local_390);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3b0,"    const auto &lhs_{{FIELD_NAME}} = {{FIELD_NAME}}();",
                 (allocator<char> *)&type);
      CodeWriter::operator+=(this_00,&local_3b0);
      std::__cxx11::string::~string((string *)&local_3b0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3d0,"    const auto &rhs_{{FIELD_NAME}} = _{{FIELD_NAME}};",
                 (allocator<char> *)&type);
      CodeWriter::operator+=(this_00,&local_3d0);
      std::__cxx11::string::~string((string *)&local_3d0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&input_type,"FIELD_NAME",(allocator<char> *)&local_4f0);
      CodeWriter::GetValue(&type,this_00,&input_type);
      std::operator+(&local_3f0,"lhs_",&type);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_510,"FIELD_NAME",(allocator<char> *)&local_4d0);
      CodeWriter::GetValue(&local_550,this_00,&local_510);
      std::operator+(&local_410,"rhs_",&local_550);
      GenComparatorForStruct(this,struct_def,4,&local_3f0,&local_410);
      std::__cxx11::string::~string((string *)&local_410);
      std::__cxx11::string::~string((string *)&local_550);
      std::__cxx11::string::~string((string *)&local_510);
      std::__cxx11::string::~string((string *)&local_3f0);
      std::__cxx11::string::~string((string *)&type);
      std::__cxx11::string::~string((string *)&input_type);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_430,"    return 0;",(allocator<char> *)&type);
      CodeWriter::operator+=(this_00,&local_430);
      psVar2 = &local_430;
    }
    goto LAB_00161f99;
  }
  type._M_dataplus._M_p._0_4_ = (field->value).type.element;
  type.field_2._8_2_ = (field->value).type.fixed_length;
  type._M_dataplus._M_p._4_4_ = 0;
  type._M_string_length = (size_type)(field->value).type.struct_def;
  type.field_2._M_allocated_capacity = (size_type)(field->value).type.enum_def;
  GenTypeGet_abi_cxx11_(&local_4d0,this,(Type *)&type,"","","",false);
  std::operator+(&local_4f0,"::flatbuffers::Array<",&local_4d0);
  std::operator+(&local_510,&local_4f0,", ");
  NumToString<unsigned_short>(&local_4b0,type.field_2._8_2_);
  std::operator+(&local_550,&local_510,&local_4b0);
  std::operator+(&input_type,&local_550,">");
  std::__cxx11::string::~string((string *)&local_550);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::__cxx11::string::~string((string *)&local_510);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::__cxx11::string::~string((string *)&local_4d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_550,"INPUT_TYPE",(allocator<char> *)&local_510);
  CodeWriter::SetValue(this_00,&local_550,&input_type);
  std::__cxx11::string::~string((string *)&local_550);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0,
             "  int KeyCompareWithValue(const {{INPUT_TYPE}} *_{{FIELD_NAME}}) const {",
             (allocator<char> *)&local_550);
  CodeWriter::operator+=(this_00,&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,
             "    const {{INPUT_TYPE}} *curr_{{FIELD_NAME}} = {{FIELD_NAME}}();",
             (allocator<char> *)&local_550);
  CodeWriter::operator+=(this_00,&local_210);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_230,
             "    for (::flatbuffers::uoffset_t i = 0; i < curr_{{FIELD_NAME}}->size(); i++) {",
             (allocator<char> *)&local_550);
  CodeWriter::operator+=(this_00,&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  if ((BaseType)type._M_dataplus._M_p - BASE_TYPE_UTYPE < 0xc) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_250,"      const auto lhs = curr_{{FIELD_NAME}}->Get(i);",
               (allocator<char> *)&local_550);
    CodeWriter::operator+=(this_00,&local_250);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_270,"      const auto rhs = _{{FIELD_NAME}}->Get(i);",
               (allocator<char> *)&local_550);
    CodeWriter::operator+=(this_00,&local_270);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_290,"      if (lhs != rhs)",(allocator<char> *)&local_550);
    CodeWriter::operator+=(this_00,&local_290);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b0,
               "        return static_cast<int>(lhs > rhs) - static_cast<int>(lhs < rhs);",
               (allocator<char> *)&local_550);
    CodeWriter::operator+=(this_00,&local_2b0);
    psVar2 = &local_2b0;
LAB_00161a39:
    std::__cxx11::string::~string((string *)psVar2);
  }
  else if (((BaseType)type._M_dataplus._M_p == BASE_TYPE_STRUCT) &&
          (*(char *)(type._M_string_length + 0x110) == '\x01')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2d0,
               "      const auto &lhs_{{FIELD_NAME}} = *(curr_{{FIELD_NAME}}->Get(i));",
               (allocator<char> *)&local_550);
    CodeWriter::operator+=(this_00,&local_2d0);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2f0,
               "      const auto &rhs_{{FIELD_NAME}} = *(_{{FIELD_NAME}}->Get(i));",
               (allocator<char> *)&local_550);
    CodeWriter::operator+=(this_00,&local_2f0);
    std::__cxx11::string::~string((string *)&local_2f0);
    struct_def_00 = type._M_string_length;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_510,"FIELD_NAME",(allocator<char> *)&local_4b0);
    CodeWriter::GetValue(&local_550,this_00,&local_510);
    std::operator+(&local_310,"lhs_",&local_550);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4d0,"FIELD_NAME",&local_551)
    ;
    CodeWriter::GetValue(&local_4f0,this_00,&local_4d0);
    std::operator+(&local_330,"rhs_",&local_4f0);
    GenComparatorForStruct(this,(StructDef *)struct_def_00,6,&local_310,&local_330);
    std::__cxx11::string::~string((string *)&local_330);
    std::__cxx11::string::~string((string *)&local_4f0);
    std::__cxx11::string::~string((string *)&local_4d0);
    std::__cxx11::string::~string((string *)&local_310);
    std::__cxx11::string::~string((string *)&local_550);
    psVar2 = &local_510;
    goto LAB_00161a39;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_350,"    }",(allocator<char> *)&local_550);
  CodeWriter::operator+=(this_00,&local_350);
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_370,"    return 0;",(allocator<char> *)&local_550);
  CodeWriter::operator+=(this_00,&local_370);
  std::__cxx11::string::~string((string *)&local_370);
  psVar2 = &input_type;
LAB_00161f99:
  std::__cxx11::string::~string((string *)psVar2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_490,"  }",(allocator<char> *)&type);
  CodeWriter::operator+=(this_00,&local_490);
  std::__cxx11::string::~string((string *)&local_490);
  return;
}

Assistant:

void GenKeyFieldMethods(const FieldDef &field) {
    FLATBUFFERS_ASSERT(field.key);
    const bool is_string = IsString(field.value.type);
    const bool is_array = IsArray(field.value.type);
    const bool is_struct = IsStruct(field.value.type);
    // Generate KeyCompareLessThan function
    code_ +=
        "  bool KeyCompareLessThan(const {{STRUCT_NAME}} * const o) const {";
    if (is_string) {
      // use operator< of ::flatbuffers::String
      code_ += "    return *{{FIELD_NAME}}() < *o->{{FIELD_NAME}}();";
    } else if (is_array || is_struct) {
      code_ += "    return KeyCompareWithValue(o->{{FIELD_NAME}}()) < 0;";
    } else {
      code_ += "    return {{FIELD_NAME}}() < o->{{FIELD_NAME}}();";
    }
    code_ += "  }";

    // Generate KeyCompareWithValue function
    if (is_string) {
      // Compares key against a null-terminated char array.
      code_ += "  int KeyCompareWithValue(const char *_{{FIELD_NAME}}) const {";
      code_ += "    return strcmp({{FIELD_NAME}}()->c_str(), _{{FIELD_NAME}});";
      code_ += "  }";
      // Compares key against any string-like object (e.g. std::string_view or
      // std::string) that implements operator< comparison with const char*.
      code_ += "  template<typename StringType>";
      code_ +=
          "  int KeyCompareWithValue(const StringType& _{{FIELD_NAME}}) const "
          "{";
      code_ +=
          "    if ({{FIELD_NAME}}()->c_str() < _{{FIELD_NAME}}) return -1;";
      code_ += "    if (_{{FIELD_NAME}} < {{FIELD_NAME}}()->c_str()) return 1;";
      code_ += "    return 0;";
    } else if (is_array) {
      const auto &elem_type = field.value.type.VectorType();
      std::string input_type = "::flatbuffers::Array<" +
                               GenTypeGet(elem_type, "", "", "", false) + ", " +
                               NumToString(elem_type.fixed_length) + ">";
      code_.SetValue("INPUT_TYPE", input_type);
      code_ +=
          "  int KeyCompareWithValue(const {{INPUT_TYPE}} *_{{FIELD_NAME}}"
          ") const {";
      code_ +=
          "    const {{INPUT_TYPE}} *curr_{{FIELD_NAME}} = {{FIELD_NAME}}();";
      code_ +=
          "    for (::flatbuffers::uoffset_t i = 0; i < "
          "curr_{{FIELD_NAME}}->size(); i++) {";

      if (IsScalar(elem_type.base_type)) {
        code_ += "      const auto lhs = curr_{{FIELD_NAME}}->Get(i);";
        code_ += "      const auto rhs = _{{FIELD_NAME}}->Get(i);";
        code_ += "      if (lhs != rhs)";
        code_ +=
            "        return static_cast<int>(lhs > rhs)"
            " - static_cast<int>(lhs < rhs);";
      } else if (IsStruct(elem_type)) {
        code_ +=
            "      const auto &lhs_{{FIELD_NAME}} = "
            "*(curr_{{FIELD_NAME}}->Get(i));";
        code_ +=
            "      const auto &rhs_{{FIELD_NAME}} = "
            "*(_{{FIELD_NAME}}->Get(i));";
        GenComparatorForStruct(*elem_type.struct_def, 6,
                               "lhs_" + code_.GetValue("FIELD_NAME"),
                               "rhs_" + code_.GetValue("FIELD_NAME"));
      }
      code_ += "    }";
      code_ += "    return 0;";
    } else if (is_struct) {
      const auto *struct_def = field.value.type.struct_def;
      code_.SetValue("INPUT_TYPE",
                     GenTypeGet(field.value.type, "", "", "", false));
      code_ +=
          "  int KeyCompareWithValue(const {{INPUT_TYPE}} &_{{FIELD_NAME}}) "
          "const {";
      code_ += "    const auto &lhs_{{FIELD_NAME}} = {{FIELD_NAME}}();";
      code_ += "    const auto &rhs_{{FIELD_NAME}} = _{{FIELD_NAME}};";
      GenComparatorForStruct(*struct_def, 4,
                             "lhs_" + code_.GetValue("FIELD_NAME"),
                             "rhs_" + code_.GetValue("FIELD_NAME"));
      code_ += "    return 0;";

    } else {
      FLATBUFFERS_ASSERT(IsScalar(field.value.type.base_type));
      auto type = GenTypeBasic(field.value.type, false);
      if (opts_.scoped_enums && field.value.type.enum_def &&
          IsScalar(field.value.type.base_type)) {
        type = GenTypeGet(field.value.type, " ", "const ", " *", true);
      }
      // Returns {field<val: -1, field==val: 0, field>val: +1}.
      code_.SetValue("KEY_TYPE", type);
      code_ +=
          "  int KeyCompareWithValue({{KEY_TYPE}} _{{FIELD_NAME}}) const {";
      code_ +=
          "    return static_cast<int>({{FIELD_NAME}}() > _{{FIELD_NAME}}) - "
          "static_cast<int>({{FIELD_NAME}}() < _{{FIELD_NAME}});";
    }
    code_ += "  }";
  }